

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     Finalize<duckdb::ModeState<short,duckdb::ModeStandard<short>>,short,duckdb::ModeFunction<duckdb::ModeStandard<short>>>
               (Vector *states,AggregateInputData *aggr_input_data,Vector *result,idx_t count,
               idx_t offset)

{
  VectorType VVar1;
  ModeState<short,_duckdb::ModeStandard<short>_> *state;
  ulong in_RCX;
  Vector *in_RDX;
  AggregateInputData *in_RSI;
  Vector *in_RDI;
  long in_R8;
  idx_t i;
  AggregateFinalizeData finalize_data_1;
  short *rdata_1;
  ModeState<short,_duckdb::ModeStandard<short>_> **sdata_1;
  AggregateFinalizeData finalize_data;
  short *rdata;
  ModeState<short,_duckdb::ModeStandard<short>_> **sdata;
  ulong local_80;
  AggregateInputData *in_stack_ffffffffffffff90;
  short *in_stack_ffffffffffffff98;
  ModeState<short,_duckdb::ModeStandard<short>_> *in_stack_ffffffffffffffa0;
  AggregateFinalizeData local_50;
  short *local_38;
  ModeState<short,_duckdb::ModeStandard<short>_> **local_30;
  long local_28;
  ulong local_20;
  Vector *local_18;
  AggregateInputData *local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  VVar1 = Vector::GetVectorType(in_RDI);
  if (VVar1 == CONSTANT_VECTOR) {
    duckdb::Vector::SetVectorType((VectorType)local_18);
    local_30 = ConstantVector::GetData<duckdb::ModeState<short,duckdb::ModeStandard<short>>*>
                         ((Vector *)0xb04550);
    local_38 = ConstantVector::GetData<short>((Vector *)0xb0455f);
    AggregateFinalizeData::AggregateFinalizeData(&local_50,local_18,local_10);
    ModeFunction<duckdb::ModeStandard<short>>::
    Finalize<short,duckdb::ModeState<short,duckdb::ModeStandard<short>>>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               (AggregateFinalizeData *)in_stack_ffffffffffffff90);
  }
  else {
    duckdb::Vector::SetVectorType((VectorType)local_18);
    FlatVector::GetData<duckdb::ModeState<short,duckdb::ModeStandard<short>>*>((Vector *)0xb045ad);
    state = (ModeState<short,_duckdb::ModeStandard<short>_> *)
            FlatVector::GetData<short>((Vector *)0xb045bc);
    AggregateFinalizeData::AggregateFinalizeData
              ((AggregateFinalizeData *)&stack0xffffffffffffff88,local_18,local_10);
    for (local_80 = 0; local_80 < local_20; local_80 = local_80 + 1) {
      ModeFunction<duckdb::ModeStandard<short>>::
      Finalize<short,duckdb::ModeState<short,duckdb::ModeStandard<short>>>
                (state,(short *)(local_80 + local_28),
                 (AggregateFinalizeData *)in_stack_ffffffffffffff90);
    }
  }
  return;
}

Assistant:

static void Finalize(Vector &states, AggregateInputData &aggr_input_data, Vector &result, idx_t count,
	                     idx_t offset) {
		if (states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);

			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			auto rdata = ConstantVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			OP::template Finalize<RESULT_TYPE, STATE_TYPE>(**sdata, *rdata, finalize_data);
		} else {
			D_ASSERT(states.GetVectorType() == VectorType::FLAT_VECTOR);
			result.SetVectorType(VectorType::FLAT_VECTOR);

			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			for (idx_t i = 0; i < count; i++) {
				finalize_data.result_idx = i + offset;
				OP::template Finalize<RESULT_TYPE, STATE_TYPE>(*sdata[i], rdata[finalize_data.result_idx],
				                                               finalize_data);
			}
		}
	}